

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
llvm::
DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
::AdvancePastEmptyBuckets
          (DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
           *this)

{
  pointer pvVar1;
  
  if (this->Ptr <= this->End) {
    pvVar1 = this->Ptr;
    while ((pvVar1 != this->End &&
           (0xfffffffffffffffd < (pvVar1->super_pair<unsigned_long,_unsigned_long>).first))) {
      pvVar1 = pvVar1 + 1;
      this->Ptr = pvVar1;
    }
    return;
  }
  __assert_fail("Ptr <= End",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                ,0x4e0,
                "void llvm::DenseMapIterator<unsigned long, unsigned long>::AdvancePastEmptyBuckets() [KeyT = unsigned long, ValueT = unsigned long, KeyInfoT = llvm::DenseMapInfo<unsigned long>, Bucket = llvm::detail::DenseMapPair<unsigned long, unsigned long>, IsConst = false]"
               );
}

Assistant:

void AdvancePastEmptyBuckets() {
    assert(Ptr <= End);
    const KeyT Empty = KeyInfoT::getEmptyKey();
    const KeyT Tombstone = KeyInfoT::getTombstoneKey();

    while (Ptr != End && (KeyInfoT::isEqual(Ptr->getFirst(), Empty) ||
                          KeyInfoT::isEqual(Ptr->getFirst(), Tombstone)))
      ++Ptr;
  }